

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

c_float compute_dua_tol(OSQPWorkspace *work,c_float eps_abs,c_float eps_rel)

{
  long *in_RDI;
  double in_XMM0_Qa;
  c_float cVar1;
  double in_XMM1_Qa;
  c_float temp_rel_eps;
  c_float max_rel_eps;
  c_float local_48;
  double local_40;
  double local_38;
  double local_30;
  c_float local_20;
  
  if ((*(long *)(in_RDI[0x17] + 0x10) == 0) || (*(long *)(in_RDI[0x17] + 0x90) != 0)) {
    cVar1 = vec_norm_inf(*(c_float **)(*in_RDI + 0x20),*(c_int *)*in_RDI);
    local_40 = vec_norm_inf((c_float *)in_RDI[0xe],*(c_int *)*in_RDI);
    if (local_40 < cVar1) {
      local_40 = cVar1;
    }
    local_48 = vec_norm_inf((c_float *)in_RDI[0xd],*(c_int *)*in_RDI);
    if (local_48 < local_40) {
      local_48 = local_40;
    }
    local_20 = local_48;
  }
  else {
    cVar1 = vec_scaled_norm_inf(*(c_float **)(in_RDI[0x18] + 0x20),*(c_float **)(*in_RDI + 0x20),
                                *(c_int *)*in_RDI);
    local_30 = vec_scaled_norm_inf(*(c_float **)(in_RDI[0x18] + 0x20),(c_float *)in_RDI[0xe],
                                   *(c_int *)*in_RDI);
    if (local_30 < cVar1) {
      local_30 = cVar1;
    }
    local_38 = vec_scaled_norm_inf(*(c_float **)(in_RDI[0x18] + 0x20),(c_float *)in_RDI[0xd],
                                   *(c_int *)*in_RDI);
    if (local_38 < local_30) {
      local_38 = local_30;
    }
    local_20 = *(double *)(in_RDI[0x18] + 0x18) * local_38;
  }
  return in_XMM1_Qa * local_20 + in_XMM0_Qa;
}

Assistant:

c_float compute_dua_tol(OSQPWorkspace *work, c_float eps_abs, c_float eps_rel) {
  c_float max_rel_eps, temp_rel_eps;

  // max_rel_eps = max(||q||, ||A' y|, ||P x||)
  if (work->settings->scaling && !work->settings->scaled_termination) {
    // || Dinv q||
    max_rel_eps = vec_scaled_norm_inf(work->scaling->Dinv,
                                      work->data->q,
                                      work->data->n);

    // || Dinv A' y ||
    temp_rel_eps = vec_scaled_norm_inf(work->scaling->Dinv,
                                       work->Aty,
                                       work->data->n);
    max_rel_eps = c_max(max_rel_eps, temp_rel_eps);

    // || Dinv P x||
    temp_rel_eps = vec_scaled_norm_inf(work->scaling->Dinv,
                                       work->Px,
                                       work->data->n);
    max_rel_eps = c_max(max_rel_eps, temp_rel_eps);

    // Multiply by cinv
    max_rel_eps *= work->scaling->cinv;
  } else { // No scaling required
    // ||q||
    max_rel_eps = vec_norm_inf(work->data->q, work->data->n);

    // ||A'*y||
    temp_rel_eps = vec_norm_inf(work->Aty, work->data->n);
    max_rel_eps  = c_max(max_rel_eps, temp_rel_eps);

    // ||P*x||
    temp_rel_eps = vec_norm_inf(work->Px, work->data->n);
    max_rel_eps  = c_max(max_rel_eps, temp_rel_eps);
  }

  // eps_dual
  return eps_abs + eps_rel * max_rel_eps;
}